

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O3

void gost_mgm128_init(mgm128_context *ctx,void *key,block128_f block,mul128_f mul_gf,int blen)

{
  memset(ctx,0,0xc0);
  ctx->block = block;
  ctx->mul_gf = mul_gf;
  ctx->key = key;
  ctx->blocklen = blen;
  return;
}

Assistant:

void gost_mgm128_init(mgm128_context *ctx, void *key, block128_f block, mul128_f mul_gf, int blen)
{
    memset(ctx, 0, sizeof(*ctx));
    ctx->block = block;
    ctx->mul_gf = mul_gf;
    ctx->key = key;
    ctx->blocklen = blen;

    /* some precalculations place here
     *
     */
}